

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_composites.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateTranspose(ValidationState_t *_,Instruction *inst)

{
  Instruction *this;
  bool bVar1;
  uint32_t id;
  DiagnosticStream *pDVar2;
  DiagnosticStream local_988;
  DiagnosticStream local_7b0;
  DiagnosticStream local_5d8;
  DiagnosticStream local_400;
  uint32_t local_224 [2];
  uint32_t matrix_component_type;
  uint32_t matrix_col_type;
  uint32_t matrix_num_cols;
  uint32_t matrix_num_rows;
  uint32_t matrix_type;
  uint32_t local_34;
  uint32_t local_30;
  uint32_t result_type;
  uint32_t result_component_type;
  uint32_t result_col_type;
  uint32_t result_num_cols;
  uint32_t result_num_rows;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  result_col_type = 0;
  result_component_type = 0;
  result_type = 0;
  local_30 = 0;
  _result_num_cols = inst;
  inst_local = (Instruction *)_;
  local_34 = Instruction::type_id(inst);
  bVar1 = ValidationState_t::GetMatrixTypeInfo
                    ((ValidationState_t *)inst_local,local_34,&result_col_type,
                     &result_component_type,&result_type,&local_30);
  if (bVar1) {
    matrix_num_cols =
         ValidationState_t::GetOperandTypeId((ValidationState_t *)inst_local,_result_num_cols,2);
    matrix_col_type = 0;
    matrix_component_type = 0;
    local_224[1] = 0;
    local_224[0] = 0;
    bVar1 = ValidationState_t::GetMatrixTypeInfo
                      ((ValidationState_t *)inst_local,matrix_num_cols,&matrix_col_type,
                       &matrix_component_type,local_224 + 1,local_224);
    if (bVar1) {
      if (local_30 == local_224[0]) {
        if ((result_col_type == matrix_component_type) && (result_component_type == matrix_col_type)
           ) {
          bVar1 = ValidationState_t::HasCapability((ValidationState_t *)inst_local,CapabilityShader)
          ;
          this = inst_local;
          if (bVar1) {
            id = Instruction::type_id(_result_num_cols);
            bVar1 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                              ((ValidationState_t *)this,id);
            if (bVar1) {
              ValidationState_t::diag
                        (&local_988,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                         _result_num_cols);
              pDVar2 = DiagnosticStream::operator<<
                                 (&local_988,
                                  (char (*) [43])"Cannot transpose matrices of 16-bit floats");
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
              DiagnosticStream::~DiagnosticStream(&local_988);
              return __local._4_4_;
            }
          }
          __local._4_4_ = SPV_SUCCESS;
        }
        else {
          ValidationState_t::diag
                    (&local_7b0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                     _result_num_cols);
          pDVar2 = DiagnosticStream::operator<<
                             (&local_7b0,
                              (char (*) [58])
                              "Expected number of columns and the column size of Matrix ");
          pDVar2 = DiagnosticStream::operator<<
                             (pDVar2,(char (*) [42])"to be the reverse of those of Result Type");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
          DiagnosticStream::~DiagnosticStream(&local_7b0);
        }
      }
      else {
        ValidationState_t::diag
                  (&local_5d8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                   _result_num_cols);
        pDVar2 = DiagnosticStream::operator<<
                           (&local_5d8,
                            (char (*) [58])
                            "Expected component types of Matrix and Result Type to be ");
        pDVar2 = DiagnosticStream::operator<<(pDVar2,(char (*) [10])"identical");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
        DiagnosticStream::~DiagnosticStream(&local_5d8);
      }
    }
    else {
      ValidationState_t::diag
                (&local_400,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,_result_num_cols)
      ;
      pDVar2 = DiagnosticStream::operator<<
                         (&local_400,(char (*) [43])"Expected Matrix to be of type OpTypeMatrix");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
      DiagnosticStream::~DiagnosticStream(&local_400);
    }
  }
  else {
    ValidationState_t::diag
              ((DiagnosticStream *)&matrix_num_rows,(ValidationState_t *)inst_local,
               SPV_ERROR_INVALID_DATA,_result_num_cols);
    pDVar2 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)&matrix_num_rows,
                        (char (*) [41])"Expected Result Type to be a matrix type");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar2);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&matrix_num_rows);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateTranspose(ValidationState_t& _, const Instruction* inst) {
  uint32_t result_num_rows = 0;
  uint32_t result_num_cols = 0;
  uint32_t result_col_type = 0;
  uint32_t result_component_type = 0;
  const uint32_t result_type = inst->type_id();
  if (!_.GetMatrixTypeInfo(result_type, &result_num_rows, &result_num_cols,
                           &result_col_type, &result_component_type)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Result Type to be a matrix type";
  }

  const uint32_t matrix_type = _.GetOperandTypeId(inst, 2);
  uint32_t matrix_num_rows = 0;
  uint32_t matrix_num_cols = 0;
  uint32_t matrix_col_type = 0;
  uint32_t matrix_component_type = 0;
  if (!_.GetMatrixTypeInfo(matrix_type, &matrix_num_rows, &matrix_num_cols,
                           &matrix_col_type, &matrix_component_type)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Matrix to be of type OpTypeMatrix";
  }

  if (result_component_type != matrix_component_type) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected component types of Matrix and Result Type to be "
           << "identical";
  }

  if (result_num_rows != matrix_num_cols ||
      result_num_cols != matrix_num_rows) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected number of columns and the column size of Matrix "
           << "to be the reverse of those of Result Type";
  }

  if (_.HasCapability(spv::Capability::Shader) &&
      _.ContainsLimitedUseIntOrFloatType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Cannot transpose matrices of 16-bit floats";
  }
  return SPV_SUCCESS;
}